

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::FormatString<char[18],char_const*,char[3],char_const*,char[3],std::__cxx11::string>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [18],char **Args_1,
          char (*Args_2) [3],char **Args_3,char (*Args_4) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_5)

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[18],char_const*,char[3],char_const*,char[3],std::__cxx11::string>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [18])this,(char **)Args,(char (*) [3])Args_1,(char **)Args_2,
             (char (*) [3])Args_3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}